

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<9992,Blob<160>>
               (hashfunc<Blob<160>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  pfHash p_Var2;
  size_type sVar3;
  byte in_CL;
  byte in_DL;
  char *pcVar4;
  uint in_ESI;
  byte in_R8B;
  byte in_R9B;
  bool result;
  Blob<160> h;
  keytype k;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> hashes;
  undefined4 in_stack_fffffffffffffacc;
  byte bVar5;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> *in_stack_fffffffffffffad0;
  Blob<9992> *in_stack_fffffffffffffad8;
  undefined1 in_stack_fffffffffffffae7;
  int in_stack_fffffffffffffae8;
  int in_stack_fffffffffffffaec;
  pfHash in_stack_fffffffffffffaf0;
  uint8_t in_stack_fffffffffffffbcb;
  uint8_t in_stack_fffffffffffffbcc;
  uint8_t in_stack_fffffffffffffbcd;
  uint8_t in_stack_fffffffffffffbce;
  uint8_t in_stack_fffffffffffffbcf;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> *in_stack_fffffffffffffbd0;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> local_28;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  hashfunc local_8 [8];
  
  local_d = in_DL & 1;
  local_e = in_CL & 1;
  local_f = in_R8B & 1;
  local_10 = in_R9B & 1;
  pcVar4 = "exactly";
  if ((in_DL & 1) != 0) {
    pcVar4 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x2708,pcVar4,(ulong)in_ESI);
  std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::vector
            ((vector<Blob<160>,_std::allocator<Blob<160>_>_> *)0x17016f);
  Blob<9992>::Blob((Blob<9992> *)&stack0xfffffffffffffaf7);
  memset(&stack0xfffffffffffffaf7,0,0x4e1);
  if ((local_d & 1) != 0) {
    Blob<160>::Blob((Blob<160> *)&stack0xfffffffffffffad0);
    p_Var2 = hashfunc::operator_cast_to_function_pointer(local_8);
    (*p_Var2)(&stack0xfffffffffffffaf7,0x4e1,0,&stack0xfffffffffffffad0);
    std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::push_back
              (in_stack_fffffffffffffad0,(value_type *)CONCAT44(in_stack_fffffffffffffacc,in_ESI));
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<9992>,Blob<160>>
            (in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec,in_stack_fffffffffffffae8,
             (bool)in_stack_fffffffffffffae7,in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  sVar3 = std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::size(&local_28);
  printf("%d keys\n",sVar3 & 0xffffffff);
  bVar5 = 1;
  bVar1 = TestHashList<Blob<160>>
                    (in_stack_fffffffffffffbd0,(bool)in_stack_fffffffffffffbcf,
                     (bool)in_stack_fffffffffffffbce,(bool)in_stack_fffffffffffffbcd,
                     (bool)in_stack_fffffffffffffbcc,(bool)in_stack_fffffffffffffbcb);
  bVar5 = bVar1 & bVar5;
  printf("\n");
  std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::~vector(in_stack_fffffffffffffad0);
  return (bool)(bVar5 & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive, bool testColl, bool testDist, bool drawDiagram  )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits, inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashtype h;

    hash(&k,sizeof(keytype),0,&h);

    hashes.push_back(h);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}